

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_write.c
# Opt level: O1

tmsize_t TIFFWriteEncodedTile(TIFF *tif,uint32_t tile,void *data,tmsize_t cc)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  uint16_t uVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  
  if (((tif->tif_flags & 0x40) != 0) ||
     (iVar5 = TIFFWriteCheck(tif,1,"TIFFWriteEncodedTile"), iVar5 != 0)) {
    if (tile < (tif->tif_dir).td_nstrips) {
      if ((((tif->tif_flags & 0x10) == 0) || (tif->tif_rawdata == (uint8_t *)0x0)) &&
         (iVar5 = TIFFWriteBufferSetup(tif,(void *)0x0,-1), iVar5 == 0)) {
        return -1;
      }
      pbVar1 = (byte *)((long)&tif->tif_flags + 2);
      *pbVar1 = *pbVar1 | 0x10;
      tif->tif_curtile = tile;
      tif->tif_curoff = 0;
      iVar5 = _TIFFReserveLargeEnoughWriteBuffer(tif,tile);
      if (iVar5 == 0) {
        return -1;
      }
      tif->tif_rawcc = 0;
      tif->tif_rawcp = tif->tif_rawdata;
      uVar2 = (tif->tif_dir).td_imagelength;
      uVar3 = (tif->tif_dir).td_tilelength;
      uVar7 = 0;
      if (uVar2 < -uVar3) {
        uVar7 = ((uVar2 + uVar3) - 1) / uVar3;
      }
      if (uVar7 != 0) {
        uVar6 = 0;
        tif->tif_row = (tile % uVar7) * uVar3;
        uVar2 = (tif->tif_dir).td_imagewidth;
        uVar3 = (tif->tif_dir).td_tilewidth;
        if (uVar2 < -uVar3) {
          uVar6 = (ulong)((uVar2 + uVar3) - 1) / (ulong)uVar3;
        }
        if ((int)uVar6 != 0) {
          tif->tif_col = (int)((ulong)tile % uVar6) * uVar3;
          if ((tif->tif_flags & 0x20) == 0) {
            iVar5 = (*tif->tif_setupencode)(tif);
            if (iVar5 == 0) {
              return -1;
            }
            *(byte *)&tif->tif_flags = (byte)tif->tif_flags | 0x20;
          }
          pbVar1 = (byte *)((long)&tif->tif_flags + 1);
          *pbVar1 = *pbVar1 & 0xef;
          if ((cc < 1) || (tif->tif_tilesize < cc)) {
            cc = tif->tif_tilesize;
          }
          if ((tif->tif_dir).td_compression == 1) {
            (*tif->tif_postdecode)(tif,(uint8_t *)data,cc);
            if ((tif->tif_flags & ((tif->tif_dir).td_fillorder | 0x100)) == 0) {
              TIFFReverseBits((uint8_t *)data,cc);
            }
            if (cc < 1) {
              return cc;
            }
            iVar5 = TIFFAppendToStrip(tif,tile,(uint8_t *)data,cc);
            if (iVar5 != 0) {
              return cc;
            }
            return -1;
          }
          uVar4 = (uint16_t)(tile / (tif->tif_dir).td_stripsperimage);
          iVar5 = (*tif->tif_preencode)(tif,uVar4);
          if (iVar5 == 0) {
            return -1;
          }
          (*tif->tif_postdecode)(tif,(uint8_t *)data,cc);
          iVar5 = (*tif->tif_encodetile)(tif,(uint8_t *)data,cc,uVar4);
          if (iVar5 == 0) {
            return -1;
          }
          iVar5 = (*tif->tif_postencode)(tif);
          if (iVar5 == 0) {
            return -1;
          }
          if ((tif->tif_flags & ((tif->tif_dir).td_fillorder | 0x100)) == 0) {
            TIFFReverseBits(tif->tif_rawdata,tif->tif_rawcc);
          }
          if ((0 < tif->tif_rawcc) &&
             (iVar5 = TIFFAppendToStrip(tif,tile,tif->tif_rawdata,tif->tif_rawcc), iVar5 == 0)) {
            return -1;
          }
          tif->tif_rawcc = 0;
          tif->tif_rawcp = tif->tif_rawdata;
          return cc;
        }
      }
      TIFFErrorExtR(tif,"TIFFWriteEncodedTile","Zero tiles");
      return -1;
    }
    TIFFErrorExtR(tif,"TIFFWriteEncodedTile","Tile %lu out of range, max %lu",(ulong)tile);
  }
  return -1;
}

Assistant:

tmsize_t TIFFWriteEncodedTile(TIFF *tif, uint32_t tile, void *data, tmsize_t cc)
{
    static const char module[] = "TIFFWriteEncodedTile";
    TIFFDirectory *td;
    uint16_t sample;
    uint32_t howmany32;

    if (!WRITECHECKTILES(tif, module))
        return ((tmsize_t)(-1));
    td = &tif->tif_dir;
    if (tile >= td->td_nstrips)
    {
        TIFFErrorExtR(tif, module, "Tile %lu out of range, max %lu",
                      (unsigned long)tile, (unsigned long)td->td_nstrips);
        return ((tmsize_t)(-1));
    }
    /*
     * Handle delayed allocation of data buffer.  This
     * permits it to be sized more intelligently (using
     * directory information).
     */
    if (!BUFFERCHECK(tif))
        return ((tmsize_t)(-1));

    tif->tif_flags |= TIFF_BUF4WRITE;

    tif->tif_curtile = tile;

    /* this informs TIFFAppendToStrip() we have changed or reset tile */
    tif->tif_curoff = 0;

    if (!_TIFFReserveLargeEnoughWriteBuffer(tif, tile))
    {
        return ((tmsize_t)(-1));
    }

    tif->tif_rawcc = 0;
    tif->tif_rawcp = tif->tif_rawdata;

    /*
     * Compute tiles per row & per column to compute
     * current row and column
     */
    howmany32 = TIFFhowmany_32(td->td_imagelength, td->td_tilelength);
    if (howmany32 == 0)
    {
        TIFFErrorExtR(tif, module, "Zero tiles");
        return ((tmsize_t)(-1));
    }
    tif->tif_row = (tile % howmany32) * td->td_tilelength;
    howmany32 = TIFFhowmany_32(td->td_imagewidth, td->td_tilewidth);
    if (howmany32 == 0)
    {
        TIFFErrorExtR(tif, module, "Zero tiles");
        return ((tmsize_t)(-1));
    }
    tif->tif_col = (tile % howmany32) * td->td_tilewidth;

    if ((tif->tif_flags & TIFF_CODERSETUP) == 0)
    {
        if (!(*tif->tif_setupencode)(tif))
            return ((tmsize_t)(-1));
        tif->tif_flags |= TIFF_CODERSETUP;
    }
    tif->tif_flags &= ~TIFF_POSTENCODE;

    /*
     * Clamp write amount to the tile size.  This is mostly
     * done so that callers can pass in some large number
     * (e.g. -1) and have the tile size used instead.
     */
    if (cc < 1 || cc > tif->tif_tilesize)
        cc = tif->tif_tilesize;

    /* shortcut to avoid an extra memcpy() */
    if (td->td_compression == COMPRESSION_NONE)
    {
        /* swab if needed - note that source buffer will be altered */
        tif->tif_postdecode(tif, (uint8_t *)data, cc);

        if (!isFillOrder(tif, td->td_fillorder) &&
            (tif->tif_flags & TIFF_NOBITREV) == 0)
            TIFFReverseBits((uint8_t *)data, cc);

        if (cc > 0 && !TIFFAppendToStrip(tif, tile, (uint8_t *)data, cc))
            return ((tmsize_t)-1);
        return (cc);
    }

    sample = (uint16_t)(tile / td->td_stripsperimage);
    if (!(*tif->tif_preencode)(tif, sample))
        return ((tmsize_t)(-1));
    /* swab if needed - note that source buffer will be altered */
    tif->tif_postdecode(tif, (uint8_t *)data, cc);

    if (!(*tif->tif_encodetile)(tif, (uint8_t *)data, cc, sample))
        return ((tmsize_t)-1);
    if (!(*tif->tif_postencode)(tif))
        return ((tmsize_t)(-1));
    if (!isFillOrder(tif, td->td_fillorder) &&
        (tif->tif_flags & TIFF_NOBITREV) == 0)
        TIFFReverseBits((uint8_t *)tif->tif_rawdata, tif->tif_rawcc);
    if (tif->tif_rawcc > 0 &&
        !TIFFAppendToStrip(tif, tile, tif->tif_rawdata, tif->tif_rawcc))
        return ((tmsize_t)(-1));
    tif->tif_rawcc = 0;
    tif->tif_rawcp = tif->tif_rawdata;
    return (cc);
}